

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

double * __thiscall trento::random::CyclicNormal<double>::operator()(CyclicNormal<double> *this)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_00000070;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_stack_00000078;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_stack_00000080;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffc8;
  double *local_28;
  
  if (in_RDI[3]._M_current < in_RDI[4]._M_current) {
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffb8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffb8);
    std::
    shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
              (in_stack_00000080,in_stack_00000078,in_stack_00000070);
    in_RDI[4]._M_current = (double *)0x0;
  }
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 5);
  std::vector<double,_std::allocator<double>_>::end(this_00);
  bVar1 = __gnu_cxx::operator==
                    (in_RDI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)this_00);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::begin(this_00);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              (in_RDI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                      this_00);
    in_RDI[5]._M_current = local_28;
    in_RDI[4]._M_current = (double *)((long)in_RDI[4]._M_current + 1);
  }
  __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
  operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
             in_stack_ffffffffffffffc8._M_current,(int)((ulong)in_RDI >> 0x20));
  pdVar2 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)&stack0xffffffffffffffc8);
  return pdVar2;
}

Assistant:

const RealType& operator()() {
    if (loop_count > n_loops_) {
      std::shuffle(cache_.begin(), cache_.end(), random::engine); 
      loop_count = 0;
    }
    if (iter_ == cache_.end()) {
      iter_ = cache_.begin();
      ++loop_count;
    }

    return *iter_++;
  }